

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

bool tcu::astc::isValidBlock(deUint8 *data,CompressedTexFormat format,AstcMode mode)

{
  bool isSRGB;
  DecompressResult DVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  byte *pbVar5;
  bool bVar6;
  IVec3 blockPixelSize;
  Block128 blockData;
  anon_union_2304_2_1776bc36 tmpBuffer;
  int local_934;
  int local_930;
  Block128 local_928;
  undefined1 local_918 [2304];
  
  getBlockPixelSize((tcu *)&local_934,format);
  isSRGB = isAstcSRGBFormat(format);
  lVar3 = 0;
  do {
    local_928.m_words[lVar3] = 0;
    lVar2 = 0;
    uVar4 = 0;
    pbVar5 = data;
    do {
      uVar4 = uVar4 | (ulong)*pbVar5 << ((byte)lVar2 & 0x3f);
      pbVar5 = pbVar5 + 1;
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x40);
    local_928.m_words[lVar3] = uVar4;
    data = data + 8;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  DVar1 = anon_unknown_0::decompressBlock
                    (local_918,&local_928,local_934,local_930,isSRGB,mode == ASTCMODE_LDR || isSRGB)
  ;
  return DVar1 == DECOMPRESS_RESULT_VALID_BLOCK;
}

Assistant:

bool isValidBlock (const deUint8* data, CompressedTexFormat format, TexDecompressionParams::AstcMode mode)
{
	const tcu::IVec3		blockPixelSize	= getBlockPixelSize(format);
	const bool				isSRGB			= isAstcSRGBFormat(format);
	const bool				isLDR			= isSRGB || mode == TexDecompressionParams::ASTCMODE_LDR;

	// sRGB is not supported in HDR mode
	DE_ASSERT(!(mode == TexDecompressionParams::ASTCMODE_HDR && isSRGB));

	union
	{
		deUint8		sRGB[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT*4];
		float		linear[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT*4];
	} tmpBuffer;
	const Block128			blockData		(data);
	const DecompressResult	result			= decompressBlock((isSRGB ? (void*)&tmpBuffer.sRGB[0] : (void*)&tmpBuffer.linear[0]),
															  blockData, blockPixelSize.x(), blockPixelSize.y(), isSRGB, isLDR);

	return result == DECOMPRESS_RESULT_VALID_BLOCK;
}